

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O2

int Sto_ManLoadNumber(FILE *pFile,int *pNumber)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  do {
    iVar2 = fgetc((FILE *)pFile);
    uVar3 = iVar2 + 1;
    if (0x21 < uVar3) goto LAB_00439eb9;
  } while ((0x200004c00U >> ((ulong)uVar3 & 0x3f) & 1) != 0);
  if ((ulong)uVar3 != 0) {
LAB_00439eb9:
    bVar1 = false;
    iVar2 = 0;
    while( true ) {
      iVar4 = iVar2;
      uVar3 = fgetc((FILE *)pFile);
      if ((uVar3 < 0x21) && ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
        iVar2 = -iVar4;
        if (!bVar1) {
          iVar2 = iVar4;
        }
        *pNumber = iVar2;
        return 1;
      }
      if (uVar3 != 0x2d && uVar3 - 0x3a < 0xfffffff6) break;
      iVar2 = iVar4 * 10 + uVar3;
      if (uVar3 == 0x2d) {
        bVar1 = true;
        iVar2 = iVar4;
      }
    }
    printf("Error: Wrong char (%c) in the input file.\n",(ulong)uVar3);
  }
  return 0;
}

Assistant:

int Sto_ManLoadNumber( FILE * pFile, int * pNumber )
{
    int Char, Number = 0, Sign = 0;
    // skip space-like chars
    do {
        Char = fgetc( pFile );
        if ( Char == EOF )
            return 0;
    } while ( Char == ' ' || Char == '\t' || Char == '\r' || Char == '\n' );
    // read the literal
    while ( 1 )
    {
        // get the next character
        Char = fgetc( pFile );
        if ( Char == ' ' || Char == '\t' || Char == '\r' || Char == '\n' )
            break;
        // check that the char is a digit
        if ( (Char < '0' || Char > '9') && Char != '-' )
        {
            printf( "Error: Wrong char (%c) in the input file.\n", Char );
            return 0;
        }
        // check if this is a minus
        if ( Char == '-' )
            Sign = 1;
        else
            Number = 10 * Number + Char;
    }
    // return the number
    *pNumber = Sign? -Number : Number;
    return 1;
}